

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_reporter.cc
# Opt level: O3

bool __thiscall benchmark::ConsoleReporter::ReportContext(ConsoleReporter *this,Context *context)

{
  ostream *poVar1;
  string str;
  char *local_50;
  long local_48;
  char local_40 [16];
  string local_30;
  
  this->name_field_width_ = context->name_field_width;
  BenchmarkReporter::PrintBasicContext((this->super_BenchmarkReporter).error_stream_,context);
  FormatString_abi_cxx11_
            (&local_30,"%-*s %13s %13s %10s\n",(ulong)(uint)this->name_field_width_,"Benchmark",
             "Time","CPU","Iterations");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_BenchmarkReporter).output_stream_,local_30._M_dataplus._M_p,
                      local_30._M_string_length);
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)local_30._M_string_length + -1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool ConsoleReporter::ReportContext(const Context& context) {
  name_field_width_ = context.name_field_width;

  PrintBasicContext(&GetErrorStream(), context);

#ifdef BENCHMARK_OS_WINDOWS
  if (color_output_ && &std::cout != &GetOutputStream()) {
      GetErrorStream() << "Color printing is only supported for stdout on windows."
                          " Disabling color printing\n";
      color_output_ = false;
  }
#endif
  std::string str = FormatString("%-*s %13s %13s %10s\n",
                             static_cast<int>(name_field_width_), "Benchmark",
                             "Time", "CPU", "Iterations");
  GetOutputStream() << str << std::string(str.length() - 1, '-') << "\n";

  return true;
}